

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  bool bVar1;
  char *pcVar2;
  pointer ppVar3;
  cmCPackIFWPackage *package_1;
  _Self local_3d0;
  iterator pit;
  string local_3c0;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined1 local_360 [8];
  string forcedOption;
  string local_338;
  allocator local_301;
  string local_300;
  char *local_2e0;
  char *option;
  cmCPackIFWPackage package;
  cmCPackIFWInstaller *this_local;
  
  package.Directory.field_2._8_8_ = this;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
          ::empty(&this->Packages);
  if ((bVar1) ||
     (bVar1 = cmCPackIFWGenerator::IsOnePackage((this->super_cmCPackIFWCommon).Generator), bVar1)) {
    cmCPackIFWPackage::cmCPackIFWPackage((cmCPackIFWPackage *)&option);
    option = (char *)(this->super_cmCPackIFWCommon).Generator;
    package.RequiresAdminRights.field_2._8_8_ = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"CPACK_IFW_PACKAGE_GROUP",&local_301);
    pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    local_2e0 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      cmCPackIFWPackage::ConfigureFromOptions((cmCPackIFWPackage *)&option);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_338,pcVar2,(allocator *)(forcedOption.field_2._M_local_buf + 0xf))
      ;
      cmCPackIFWPackage::ConfigureFromGroup((cmCPackIFWPackage *)&option,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator((allocator<char> *)(forcedOption.field_2._M_local_buf + 0xf))
      ;
      pcVar2 = local_2e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3c0,pcVar2,(allocator *)((long)&pit._M_node + 7));
      cmsys::SystemTools::UpperCase(&local_3a0,&local_3c0);
      std::operator+(&local_380,"CPACK_IFW_COMPONENT_GROUP_",&local_3a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     &local_380,"_FORCED_INSTALLATION");
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pit._M_node + 7));
      pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_360);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)(package.Virtual.field_2._M_local_buf + 8),"true")
        ;
      }
      std::__cxx11::string::~string((string *)local_360);
    }
    cmCPackIFWPackage::GeneratePackageFile((cmCPackIFWPackage *)&option);
    cmCPackIFWPackage::~cmCPackIFWPackage((cmCPackIFWPackage *)&option);
  }
  else {
    local_3d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
         ::begin(&this->Packages);
    while( true ) {
      package_1 = (cmCPackIFWPackage *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
                  ::end(&this->Packages);
      bVar1 = std::operator!=(&local_3d0,(_Self *)&package_1);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>
               ::operator->(&local_3d0);
      cmCPackIFWPackage::GeneratePackageFile(ppVar3->second);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>
      ::operator++(&local_3d0);
    }
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (this->Packages.empty() || this->Generator->IsOnePackage()) {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = this->Generator;
    package.Installer = this;
    // Check package group
    if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
      package.ConfigureFromGroup(option);
      std::string forcedOption = "CPACK_IFW_COMPONENT_GROUP_" +
        cmsys::SystemTools::UpperCase(option) + "_FORCED_INSTALLATION";
      if (!GetOption(forcedOption)) {
        package.ForcedInstallation = "true";
      }
    } else {
      package.ConfigureFromOptions();
    }
    package.GeneratePackageFile();
    return;
  }

  // Generate packages meta information
  for (PackagesMap::iterator pit = this->Packages.begin();
       pit != this->Packages.end(); ++pit) {
    cmCPackIFWPackage* package = pit->second;
    package->GeneratePackageFile();
  }
}